

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# otherFun.cpp
# Opt level: O1

int set_noblock(int sockfd)

{
  uint uVar1;
  int iVar2;
  
  if (sockfd < 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"sockfd is invailed",0x12);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x30);
    std::ostream::put(-0x30);
    std::ostream::flush();
    iVar2 = -1;
  }
  else {
    uVar1 = fcntl(sockfd,3,0);
    fcntl(sockfd,4,(ulong)(uVar1 | 0x800));
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int set_noblock(int sockfd)
{
    if(sockfd < 0)
    {
        cout<<"sockfd is invailed"<<endl;
        return -1;
    }
    int flags = fcntl(sockfd,F_GETFL,0);
    fcntl(sockfd,F_SETFL,flags | O_NONBLOCK);
    return 1;
}